

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fNegativeVertexArrayApiTests.cpp
# Opt level: O1

void deqp::gles31::Functional::NegativeTestShared::
     draw_range_elements_base_vertex_primitive_mode_mismatch(NegativeTestContext *ctx)

{
  RenderContext *renderCtx;
  long lVar1;
  long *local_218;
  long local_210;
  long local_208 [2];
  GLfloat vertices [1];
  value_type local_1e8;
  undefined1 local_1c8 [16];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1b8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  avStack_198 [4];
  vector<glu::AttribLocationBinding,_std::allocator<glu::AttribLocationBinding>_> local_138;
  undefined1 local_118 [24];
  bool bStack_100;
  ShaderProgram geometryProgram;
  
  renderCtx = ctx->m_renderCtx;
  local_118[0x10] = 0;
  stack0xfffffffffffffef9 = 0;
  local_118._0_8_ = (pointer)0x0;
  local_118[8] = 0;
  local_118._9_7_ = 0;
  memset(local_1c8,0,0xac);
  bStack_100 = true;
  local_218 = local_208;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_218,
             "#version 320 es\nlayout(points) in;\nlayout(points, max_vertices = 3) out;\nvoid main (void)\n{\n}\n"
             ,"");
  local_1e8._M_dataplus._M_p = (pointer)&local_1e8.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_1e8,local_218,local_210 + (long)local_218);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(avStack_198,&local_1e8);
  glu::ShaderProgram::ShaderProgram(&geometryProgram,renderCtx,(ProgramSources *)local_1c8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1e8._M_dataplus._M_p != &local_1e8.field_2) {
    operator_delete(local_1e8._M_dataplus._M_p,local_1e8.field_2._M_allocated_capacity + 1);
  }
  if (local_218 != local_208) {
    operator_delete(local_218,local_208[0] + 1);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_118);
  std::vector<glu::AttribLocationBinding,_std::allocator<glu::AttribLocationBinding>_>::~vector
            (&local_138);
  lVar1 = 0x78;
  do {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)(local_1c8 + lVar1));
    lVar1 = lVar1 + -0x18;
  } while (lVar1 != -0x18);
  local_1c8._0_8_ = &local_1b8;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_1c8,
             "GL_INVALID_OPERATION is generated if a geometry shader is active and mode is incompatible with the input primitive type of the geometry shader in the currently installed program object."
             ,"");
  NegativeTestContext::beginSection(ctx,(string *)local_1c8);
  if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1c8._0_8_ !=
      &local_1b8) {
    operator_delete((void *)local_1c8._0_8_,(ulong)(local_1b8._M_dataplus._M_p + 1));
  }
  glu::CallLogWrapper::glUseProgram(&ctx->super_CallLogWrapper,geometryProgram.m_program.m_program);
  glu::CallLogWrapper::glDrawRangeElementsBaseVertex
            (&ctx->super_CallLogWrapper,4,0,1,1,0x1405,vertices,1);
  NegativeTestContext::expectError(ctx,0x502);
  NegativeTestContext::endSection(ctx);
  glu::CallLogWrapper::glUseProgram(&ctx->super_CallLogWrapper,0);
  glu::ShaderProgram::~ShaderProgram(&geometryProgram);
  return;
}

Assistant:

void draw_range_elements_base_vertex_primitive_mode_mismatch (NegativeTestContext& ctx)
{
	GLfloat				vertices[1];
	glu::ShaderProgram	geometryProgram	(ctx.getRenderContext(), glu::ProgramSources() << glu::ProgramSeparable(true) << glu::GeometrySource(geometryShaderSource));

	ctx.beginSection("GL_INVALID_OPERATION is generated if a geometry shader is active and mode is incompatible with the input primitive type of the geometry shader in the currently installed program object.");
	ctx.glUseProgram(geometryProgram.getProgram());
	ctx.glDrawRangeElementsBaseVertex(GL_TRIANGLES, 0, 1, 1, GL_UNSIGNED_INT, vertices, 1);
	ctx.expectError(GL_INVALID_OPERATION);
	ctx.endSection();

	ctx.glUseProgram(0);
}